

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  sqlite3_int64 sStack_38;
  int rc;
  sqlite3_int64 iHwtr;
  sqlite3_int64 iCur;
  int *piStack_20;
  int resetFlag_local;
  int *pHighwater_local;
  int *pCurrent_local;
  int op_local;
  
  iHwtr = 0;
  sStack_38 = 0;
  iCur._4_4_ = resetFlag;
  piStack_20 = pHighwater;
  pHighwater_local = pCurrent;
  pCurrent_local._4_4_ = op;
  iVar1 = sqlite3_status64(op,&iHwtr,&stack0xffffffffffffffc8,resetFlag);
  if (iVar1 == 0) {
    *pHighwater_local = (int)iHwtr;
    *piStack_20 = (int)sStack_38;
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  sqlite3_int64 iCur = 0, iHwtr = 0;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  rc = sqlite3_status64(op, &iCur, &iHwtr, resetFlag);
  if( rc==0 ){
    *pCurrent = (int)iCur;
    *pHighwater = (int)iHwtr;
  }
  return rc;
}